

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

void Abc_TtExpand(word *pTruth0,int nVars,int *pCut0,int nCutSize0,int *pCut,int nCutSize)

{
  uint iVar;
  
  do {
    iVar = nCutSize0 - 1;
    do {
      if ((nCutSize < 1) || (nCutSize0 < 1)) {
        if (nCutSize0 == 0) {
          return;
        }
        __assert_fail("k == -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilTruth.h"
                      ,0x59c,"void Abc_TtExpand(word *, int, int *, int, int *, int)");
      }
      nCutSize = nCutSize - 1;
    } while (pCut0[iVar] < pCut[(uint)nCutSize]);
    if (pCut[(uint)nCutSize] != pCut0[iVar]) {
      __assert_fail("pCut[i] == pCut0[k]",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilTruth.h"
                    ,0x597,"void Abc_TtExpand(word *, int, int *, int, int *, int)");
    }
    nCutSize0 = iVar;
    if (iVar < (uint)nCutSize) {
      Abc_TtSwapVars(pTruth0,nVars,iVar,nCutSize);
    }
  } while( true );
}

Assistant:

static inline void Abc_TtExpand( word * pTruth0, int nVars, int * pCut0, int nCutSize0, int * pCut, int nCutSize )
{
    int i, k;
    for ( i = nCutSize - 1, k = nCutSize0 - 1; i >= 0 && k >= 0; i-- )
    {
        if ( pCut[i] > pCut0[k] )
            continue;
        assert( pCut[i] == pCut0[k] );
        if ( k < i )
            Abc_TtSwapVars( pTruth0, nVars, k, i );
        k--;
    }
    assert( k == -1 );
}